

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ARB_bindless_texture(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_bindless_texture != 0) {
    glad_glGetTextureHandleARB = (PFNGLGETTEXTUREHANDLEARBPROC)(*load)("glGetTextureHandleARB");
    glad_glGetTextureSamplerHandleARB =
         (PFNGLGETTEXTURESAMPLERHANDLEARBPROC)(*load)("glGetTextureSamplerHandleARB");
    glad_glMakeTextureHandleResidentARB =
         (PFNGLMAKETEXTUREHANDLERESIDENTARBPROC)(*load)("glMakeTextureHandleResidentARB");
    glad_glMakeTextureHandleNonResidentARB =
         (PFNGLMAKETEXTUREHANDLENONRESIDENTARBPROC)(*load)("glMakeTextureHandleNonResidentARB");
    glad_glGetImageHandleARB = (PFNGLGETIMAGEHANDLEARBPROC)(*load)("glGetImageHandleARB");
    glad_glMakeImageHandleResidentARB =
         (PFNGLMAKEIMAGEHANDLERESIDENTARBPROC)(*load)("glMakeImageHandleResidentARB");
    glad_glMakeImageHandleNonResidentARB =
         (PFNGLMAKEIMAGEHANDLENONRESIDENTARBPROC)(*load)("glMakeImageHandleNonResidentARB");
    glad_glUniformHandleui64ARB = (PFNGLUNIFORMHANDLEUI64ARBPROC)(*load)("glUniformHandleui64ARB");
    glad_glUniformHandleui64vARB =
         (PFNGLUNIFORMHANDLEUI64VARBPROC)(*load)("glUniformHandleui64vARB");
    glad_glProgramUniformHandleui64ARB =
         (PFNGLPROGRAMUNIFORMHANDLEUI64ARBPROC)(*load)("glProgramUniformHandleui64ARB");
    glad_glProgramUniformHandleui64vARB =
         (PFNGLPROGRAMUNIFORMHANDLEUI64VARBPROC)(*load)("glProgramUniformHandleui64vARB");
    glad_glIsTextureHandleResidentARB =
         (PFNGLISTEXTUREHANDLERESIDENTARBPROC)(*load)("glIsTextureHandleResidentARB");
    glad_glIsImageHandleResidentARB =
         (PFNGLISIMAGEHANDLERESIDENTARBPROC)(*load)("glIsImageHandleResidentARB");
    glad_glVertexAttribL1ui64ARB =
         (PFNGLVERTEXATTRIBL1UI64ARBPROC)(*load)("glVertexAttribL1ui64ARB");
    glad_glVertexAttribL1ui64vARB =
         (PFNGLVERTEXATTRIBL1UI64VARBPROC)(*load)("glVertexAttribL1ui64vARB");
    glad_glGetVertexAttribLui64vARB =
         (PFNGLGETVERTEXATTRIBLUI64VARBPROC)(*load)("glGetVertexAttribLui64vARB");
  }
  return;
}

Assistant:

static void load_GL_ARB_bindless_texture(GLADloadproc load) {
	if(!GLAD_GL_ARB_bindless_texture) return;
	glad_glGetTextureHandleARB = (PFNGLGETTEXTUREHANDLEARBPROC)load("glGetTextureHandleARB");
	glad_glGetTextureSamplerHandleARB = (PFNGLGETTEXTURESAMPLERHANDLEARBPROC)load("glGetTextureSamplerHandleARB");
	glad_glMakeTextureHandleResidentARB = (PFNGLMAKETEXTUREHANDLERESIDENTARBPROC)load("glMakeTextureHandleResidentARB");
	glad_glMakeTextureHandleNonResidentARB = (PFNGLMAKETEXTUREHANDLENONRESIDENTARBPROC)load("glMakeTextureHandleNonResidentARB");
	glad_glGetImageHandleARB = (PFNGLGETIMAGEHANDLEARBPROC)load("glGetImageHandleARB");
	glad_glMakeImageHandleResidentARB = (PFNGLMAKEIMAGEHANDLERESIDENTARBPROC)load("glMakeImageHandleResidentARB");
	glad_glMakeImageHandleNonResidentARB = (PFNGLMAKEIMAGEHANDLENONRESIDENTARBPROC)load("glMakeImageHandleNonResidentARB");
	glad_glUniformHandleui64ARB = (PFNGLUNIFORMHANDLEUI64ARBPROC)load("glUniformHandleui64ARB");
	glad_glUniformHandleui64vARB = (PFNGLUNIFORMHANDLEUI64VARBPROC)load("glUniformHandleui64vARB");
	glad_glProgramUniformHandleui64ARB = (PFNGLPROGRAMUNIFORMHANDLEUI64ARBPROC)load("glProgramUniformHandleui64ARB");
	glad_glProgramUniformHandleui64vARB = (PFNGLPROGRAMUNIFORMHANDLEUI64VARBPROC)load("glProgramUniformHandleui64vARB");
	glad_glIsTextureHandleResidentARB = (PFNGLISTEXTUREHANDLERESIDENTARBPROC)load("glIsTextureHandleResidentARB");
	glad_glIsImageHandleResidentARB = (PFNGLISIMAGEHANDLERESIDENTARBPROC)load("glIsImageHandleResidentARB");
	glad_glVertexAttribL1ui64ARB = (PFNGLVERTEXATTRIBL1UI64ARBPROC)load("glVertexAttribL1ui64ARB");
	glad_glVertexAttribL1ui64vARB = (PFNGLVERTEXATTRIBL1UI64VARBPROC)load("glVertexAttribL1ui64vARB");
	glad_glGetVertexAttribLui64vARB = (PFNGLGETVERTEXATTRIBLUI64VARBPROC)load("glGetVertexAttribLui64vARB");
}